

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_brts_no_zeroinit.h
# Opt level: O3

void __thiscall BRTS_XZ<TTA>::PerformLabeling(BRTS_XZ<TTA> *this)

{
  undefined8 uVar1;
  ushort uVar2;
  uint height;
  uint uVar3;
  uint uVar4;
  Mat1b *pMVar5;
  int *piVar6;
  Mat1i *pMVar7;
  long lVar8;
  long lVar9;
  uint *puVar10;
  Run *pRVar11;
  int iVar12;
  uint uVar13;
  uint64_t *puVar14;
  Run *pRVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  ulong uVar20;
  long lVar21;
  uint uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  int iVar26;
  undefined1 auVar25 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  long local_c0;
  Mat local_90 [96];
  
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  height = *(uint *)&pMVar5->field_0x8;
  uVar3 = *(uint *)&pMVar5->field_0xc;
  (this->data_compressed).height = height;
  (this->data_compressed).width = uVar3;
  uVar13 = uVar3 + 0x3f;
  if (-1 < (int)uVar3) {
    uVar13 = uVar3;
  }
  iVar12 = ((int)uVar13 >> 6) + 1;
  (this->data_compressed).data_width = iVar12;
  uVar13 = iVar12 * height;
  uVar16 = 0xffffffffffffffff;
  if (-1 < (int)uVar13) {
    uVar16 = (ulong)uVar13 * 8;
  }
  puVar14 = (uint64_t *)operator_new__(uVar16);
  (this->data_compressed).bits = puVar14;
  InitCompressedData(this,&this->data_compressed);
  (this->data_runs).height = height;
  (this->data_runs).width = uVar3;
  pRVar15 = (Run *)operator_new__((ulong)(((uVar3 >> 1) + 2) * height + 1) << 3);
  (this->data_runs).runs = pRVar15;
  uVar1 = *(undefined8 *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  TTA::Alloc((((int)((ulong)uVar1 >> 0x20) + 1) / 2) * (((int)uVar1 + 1) / 2) + 1);
  *TTA::rtable_ = 0;
  TTA::length_ = 1;
  FindRuns(this,(this->data_compressed).bits,height,(this->data_compressed).data_width,
           (this->data_runs).runs);
  pRVar15 = (this->data_runs).runs;
  piVar6 = *(int **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  cv::Mat::Mat(local_90,*piVar6,piVar6[1],4);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_90);
  cv::Mat::~Mat(local_90);
  if (0 < (int)height) {
    pMVar7 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    lVar8 = *(long *)&pMVar7->field_0x10;
    lVar9 = **(long **)&pMVar7->field_0x48;
    local_c0 = lVar8 + 8;
    uVar16 = 0;
    auVar27 = _DAT_00328420;
    auVar28 = _DAT_00328430;
    auVar29 = _DAT_00328440;
    do {
      puVar10 = TTA::rtable_;
      lVar21 = lVar9 * uVar16 + lVar8;
      uVar13 = 0;
      pRVar11 = pRVar15;
      do {
        pRVar15 = pRVar11;
        if (pRVar15->start_pos == 0xffff) {
          if ((int)uVar13 < (int)uVar3) {
            memset((void *)((long)(int)uVar13 * 4 + lVar21),0,(ulong)(~uVar13 + uVar3) * 4 + 4);
            auVar27 = _DAT_00328420;
            auVar28 = _DAT_00328430;
            auVar29 = _DAT_00328440;
          }
          pRVar15 = pRVar15 + 1;
          break;
        }
        uVar2 = pRVar15->end_pos;
        uVar4 = puVar10[pRVar15->label];
        uVar22 = (uint)pRVar15->start_pos;
        if (uVar13 < uVar22) {
          memset((void *)((long)(int)uVar13 * 4 + lVar21),0,(ulong)(~uVar13 + uVar22) * 4 + 4);
          auVar27 = _DAT_00328420;
          auVar28 = _DAT_00328430;
          auVar29 = _DAT_00328440;
          uVar13 = uVar22;
        }
        if (uVar13 < uVar2) {
          lVar17 = (long)(int)uVar13;
          uVar13 = (uint)uVar2;
          lVar18 = (ulong)uVar2 - lVar17;
          lVar19 = lVar18 + -1;
          auVar23._8_4_ = (int)lVar19;
          auVar23._0_8_ = lVar19;
          auVar23._12_4_ = (int)((ulong)lVar19 >> 0x20);
          lVar17 = local_c0 + lVar17 * 4;
          auVar23 = auVar23 ^ auVar29;
          uVar20 = 0;
          do {
            auVar24._8_4_ = (int)uVar20;
            auVar24._0_8_ = uVar20;
            auVar24._12_4_ = (int)(uVar20 >> 0x20);
            auVar25 = (auVar24 | auVar28) ^ auVar29;
            iVar12 = auVar23._4_4_;
            if ((bool)(~(iVar12 < auVar25._4_4_ ||
                        auVar23._0_4_ < auVar25._0_4_ && auVar25._4_4_ == iVar12) & 1)) {
              *(uint *)(lVar17 + -8 + uVar20 * 4) = uVar4;
            }
            if (auVar25._12_4_ <= auVar23._12_4_ &&
                (auVar25._8_4_ <= auVar23._8_4_ || auVar25._12_4_ != auVar23._12_4_)) {
              *(uint *)(lVar17 + -4 + uVar20 * 4) = uVar4;
            }
            auVar24 = (auVar24 | auVar27) ^ auVar29;
            iVar26 = auVar24._4_4_;
            if (iVar26 <= iVar12 && (iVar26 != iVar12 || auVar24._0_4_ <= auVar23._0_4_)) {
              *(uint *)(lVar17 + uVar20 * 4) = uVar4;
              *(uint *)(lVar17 + 4 + uVar20 * 4) = uVar4;
            }
            uVar20 = uVar20 + 4;
          } while ((lVar18 + 3U & 0xfffffffffffffffc) != uVar20);
        }
        pRVar11 = pRVar15 + 1;
      } while (uVar22 != 0xffff);
      uVar16 = uVar16 + 1;
      local_c0 = local_c0 + lVar9;
    } while (uVar16 != height);
  }
  TTA::Dealloc();
  pRVar15 = (this->data_runs).runs;
  if (pRVar15 != (Run *)0x0) {
    operator_delete__(pRVar15);
  }
  puVar14 = (this->data_compressed).bits;
  if (puVar14 != (uint64_t *)0x0) {
    operator_delete__(puVar14);
  }
  return;
}

Assistant:

void PerformLabeling()
    {
        int w(img_.cols);
        int h(img_.rows);

        data_compressed.Alloc(h, w);
        InitCompressedData(data_compressed);

        //find runs
        data_runs.Alloc(h, w);
        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::Setup();
        FindRuns(data_compressed.bits, h, data_compressed.data_width, data_runs.runs);

        Run* runs = data_runs.runs;
        img_labels_ = cv::Mat1i(img_.size());
        for (int i = 0; i < h; i++) {
            unsigned* const labels = img_labels_.ptr<unsigned>(i);
            for (int j = 0;; runs++) {
                unsigned short start_pos = runs->start_pos;
                if (start_pos == 0xFFFF) {
                    for (; j < w; j++) labels[j] = 0;
                    runs++;
                    break;
                }
                unsigned short end_pos = runs->end_pos;
                int label = LabelsSolver::GetLabel(runs->label);
                for (; j < start_pos; j++) labels[j] = 0;
                for (; j < end_pos; j++) labels[j] = label;
            }
        }

        LabelsSolver::Dealloc();
        data_runs.Dealloc();
        data_compressed.Dealloc();
    }